

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O0

DecodeStatus decodeMemRIOperands(MCInst *Inst,uint64_t Imm,int64_t Address,void *Decoder)

{
  uint uVar1;
  ulong uVar2;
  MCOperand *Op;
  int64_t Val;
  ulong in_RSI;
  MCInst *in_RDI;
  uint64_t Disp;
  uint64_t Base;
  DecodeStatus local_4;
  
  uVar2 = in_RSI >> 0x10;
  if (uVar2 < 0x20) {
    uVar1 = MCInst_getOpcode(in_RDI);
    if (((((uVar1 == 0x25c) || (uVar1 == 0x271)) || (uVar1 == 0x277)) ||
        ((uVar1 == 0x27c || (uVar1 == 0x287)))) || (uVar1 == 0x2a5)) {
      MCOperand_CreateReg0(in_RDI,GP0Regs[uVar2]);
    }
    else if (((uVar1 == 0x41a) || (uVar1 == 0x428)) ||
            ((uVar1 == 0x42d || ((uVar1 == 0x434 || (uVar1 == 0x446)))))) {
      Op = MCOperand_CreateReg1(in_RDI,GP0Regs[uVar2]);
      MCInst_insert0(in_RDI,0,Op);
    }
    Val = SignExtend64(in_RSI & 0xffff,0x10);
    MCOperand_CreateImm0(in_RDI,Val);
    MCOperand_CreateReg0(in_RDI,GP0Regs[uVar2]);
    local_4 = MCDisassembler_Success;
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus decodeMemRIOperands(MCInst *Inst, uint64_t Imm,
		int64_t Address, const void *Decoder)
{
	// Decode the memri field (imm, reg), which has the low 16-bits as the
	// displacement and the next 5 bits as the register #.

	uint64_t Base = Imm >> 16;
	uint64_t Disp = Imm & 0xFFFF;

	// assert(Base < 32 && "Invalid base register");
	if (Base >= 32)
		return MCDisassembler_Fail;

	switch (MCInst_getOpcode(Inst)) {
		default: break;
		case PPC_LBZU:
		case PPC_LHAU:
		case PPC_LHZU:
		case PPC_LWZU:
		case PPC_LFSU:
		case PPC_LFDU:
				 // Add the tied output operand.
				 MCOperand_CreateReg0(Inst, GP0Regs[Base]);
				 break;
		case PPC_STBU:
		case PPC_STHU:
		case PPC_STWU:
		case PPC_STFSU:
		case PPC_STFDU:
				 MCInst_insert0(Inst, 0, MCOperand_CreateReg1(Inst, GP0Regs[Base]));
				 break;
	}

	MCOperand_CreateImm0(Inst, SignExtend64(Disp, 16));
	MCOperand_CreateReg0(Inst, GP0Regs[Base]);
	return MCDisassembler_Success;
}